

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Vector<kj::String>::~Vector(Vector<kj::String> *this)

{
  String *pSVar1;
  RemoveConst<kj::String> *pRVar2;
  String *pSVar3;
  ArrayDisposer *pAVar4;
  
  pSVar1 = (this->builder).ptr;
  if (pSVar1 != (String *)0x0) {
    pRVar2 = (this->builder).pos;
    pSVar3 = (this->builder).endPtr;
    (this->builder).ptr = (String *)0x0;
    (this->builder).pos = (RemoveConst<kj::String> *)0x0;
    (this->builder).endPtr = (String *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pSVar1,0x18,((long)pRVar2 - (long)pSVar1 >> 3) * -0x5555555555555555,
               ((long)pSVar3 - (long)pSVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }